

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O0

bool DiffTest<Blob<256>,unsigned_int>(pfHash hash,int diffbits,int reps,bool dumpCollisions)

{
  bool bVar1;
  uint in_EDX;
  uint in_ESI;
  code *in_RDI;
  double dVar2;
  double dVar3;
  bool result;
  int i;
  uint h2;
  uint h1;
  Blob<256> k2;
  Blob<256> k1;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> diffs;
  Rand r;
  double expected;
  double testcount;
  double diffcount;
  int hashbits;
  int keybits;
  uint32_t in_stack_ffffffffffffff1c;
  Rand *in_stack_ffffffffffffff20;
  undefined2 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  void *blob;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  byte bVar4;
  int local_b8;
  undefined1 local_b0 [12];
  int in_stack_ffffffffffffff5c;
  uint *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  Blob<256> *in_stack_ffffffffffffff70;
  Blob<256> *in_stack_ffffffffffffff78;
  pfHash in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff90;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> *in_stack_ffffffffffffff98;
  
  dVar2 = chooseUpToK((int)((ulong)in_stack_ffffffffffffff20 >> 0x20),(int)in_stack_ffffffffffffff20
                     );
  blob = (void *)(dVar2 * (double)(int)in_EDX);
  dVar3 = pow(2.0,32.0);
  dVar3 = (double)blob / dVar3;
  Rand::Rand(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::vector
            ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)0x12dcc1);
  Blob<256>::Blob((Blob<256> *)&stack0xffffffffffffff80);
  Blob<256>::Blob((Blob<256> *)(local_b0 + 4));
  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",dVar2,
         (ulong)in_ESI,0x100,0x20);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",
         (void *)(dVar2 * (double)(int)in_EDX),dVar3,(ulong)in_EDX);
  for (local_b8 = 0; local_b8 < (int)in_EDX; local_b8 = local_b8 + 1) {
    in_stack_ffffffffffffff34 = local_b8;
    if (local_b8 % ((int)in_EDX / 10) == 0) {
      printf(".");
    }
    Rand::rand_p((Rand *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),blob,
                 in_stack_ffffffffffffff34);
    Blob<256>::operator=((Blob<256> *)(local_b0 + 4),(Blob<256> *)&stack0xffffffffffffff80);
    (*in_RDI)(&stack0xffffffffffffff80,0x20,0,local_b0);
    DiffTestRecurse<Blob<256>,unsigned_int>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               (uint *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff98);
  }
  printf("\n");
  bVar4 = 1;
  bVar1 = ProcessDifferentials<Blob<256>>
                    ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)in_stack_ffffffffffffff70,
                     in_stack_ffffffffffffff6c,SUB41((uint)in_stack_ffffffffffffff68 >> 0x18,0));
  bVar4 = (bVar4 & 1 & bVar1) != 0;
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::~vector
            ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)
             CONCAT44(in_stack_ffffffffffffff34,
                      CONCAT13(bVar1,CONCAT12(bVar4,in_stack_ffffffffffffff30))));
  return (bool)(bVar4 & 1);
}

Assistant:

bool DiffTest ( pfHash hash, int diffbits, int reps, bool dumpCollisions )
{
  const int keybits = sizeof(keytype) * 8;
  const int hashbits = sizeof(hashtype) * 8;

  double diffcount = chooseUpToK(keybits,diffbits);
  double testcount = (diffcount * double(reps));
  double expected  = testcount / pow(2.0,double(hashbits));

  Rand r(100);

  std::vector<keytype> diffs;

  keytype k1,k2;
  hashtype h1,h2;

  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",
         diffcount,diffbits,keybits,hashbits);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",
         reps,testcount,expected);

  for(int i = 0; i < reps; i++)
  {
    if(i % (reps/10) == 0) printf(".");

    r.rand_p(&k1,sizeof(keytype));
    k2 = k1;

    hash(&k1,sizeof(k1),0,(uint32_t*)&h1);

    DiffTestRecurse<keytype,hashtype>(hash,k1,k2,h1,h2,0,diffbits,diffs);
  }
  printf("\n");

  bool result = true;

  result &= ProcessDifferentials(diffs,reps,dumpCollisions);

  return result;
}